

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> *
__thiscall
Catch::Clara::Parser::getHelpColumns
          (vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
           *__return_storage_ptr__,Parser *this)

{
  pointer pOVar1;
  pointer this_00;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  childCols;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar1 = (this->m_options).
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_options).
                 super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pOVar1; this_00 = this_00 + 1) {
    Opt::getHelpColumns(&local_38,this_00);
    std::vector<Catch::Clara::Detail::HelpColumns,std::allocator<Catch::Clara::Detail::HelpColumns>>
    ::
    insert<__gnu_cxx::__normal_iterator<Catch::Clara::Detail::HelpColumns*,std::vector<Catch::Clara::Detail::HelpColumns,std::allocator<Catch::Clara::Detail::HelpColumns>>>,void>
              ((vector<Catch::Clara::Detail::HelpColumns,std::allocator<Catch::Clara::Detail::HelpColumns>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                )local_38.
                 super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                )local_38.
                 super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>::
    ~vector(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Detail::HelpColumns> Parser::getHelpColumns() const {
            std::vector<Detail::HelpColumns> cols;
            for (auto const &o : m_options) {
                auto childCols = o.getHelpColumns();
                cols.insert(cols.end(), childCols.begin(), childCols.end());
            }
            return cols;
        }